

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O3

void __thiscall DAnimatedDoor::Tick(DAnimatedDoor *this)

{
  uint uVar1;
  int *piVar2;
  uint32_t *puVar3;
  FDoorAnimation *pFVar4;
  bool bVar5;
  FTextureID *pFVar6;
  int iVar7;
  int iVar8;
  line_t_conflict *plVar9;
  side_t *psVar10;
  
  pFVar4 = this->m_DoorAnim;
  if (pFVar4 == (FDoorAnimation *)0x0) goto LAB_003eb6cc;
  switch(this->m_Status) {
  case 0:
    piVar2 = &this->m_Timer;
    iVar7 = *piVar2;
    *piVar2 = *piVar2 + -1;
    if (iVar7 != 0) {
      return;
    }
    iVar7 = this->m_Frame;
    iVar8 = iVar7 + 1;
    this->m_Frame = iVar8;
    if (pFVar4->NumTextureFrames <= iVar8) {
      puVar3 = &this->m_Line1->flags;
      *puVar3 = *puVar3 & 0xfffffffe;
      puVar3 = &this->m_Line2->flags;
      *puVar3 = *puVar3 & 0xfffffffe;
      if (this->m_Delay != 0) {
        this->m_Timer = this->m_Delay;
        this->m_Status = 1;
        return;
      }
      goto switchD_003eb5d0_caseD_3;
    }
    this->m_Timer = this->m_Speed;
    plVar9 = this->m_Line1;
    psVar10 = plVar9->sidedef[0];
    pFVar6 = pFVar4->TextureFrames;
    iVar7 = pFVar6[(long)iVar7 + 1].texnum;
    break;
  case 1:
    piVar2 = &this->m_Timer;
    iVar7 = *piVar2;
    *piVar2 = *piVar2 + -1;
    if (iVar7 != 0) {
      return;
    }
    bVar5 = StartClosing(this);
    if (bVar5) {
      return;
    }
    this->m_Timer = this->m_Delay;
    return;
  case 2:
    piVar2 = &this->m_Timer;
    iVar7 = *piVar2;
    *piVar2 = *piVar2 + -1;
    if (iVar7 != 0) {
      return;
    }
    iVar7 = this->m_Frame;
    uVar1 = iVar7 - 1;
    this->m_Frame = uVar1;
    if (iVar7 < 1) {
      sector_t::MoveCeiling
                ((sector_t *)(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                 2048.0,this->m_BotDist,-1,-1,false);
      (((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->ceilingdata).
      field_0.p = (DSectorEffect *)0x0;
      (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
        _vptr_DObject[4])(this);
      if (this->m_SetBlocking1 == false) {
        puVar3 = &this->m_Line1->flags;
        *puVar3 = *puVar3 & 0xfffffffe;
      }
      if (this->m_SetBlocking2 != false) {
        return;
      }
      puVar3 = &this->m_Line2->flags;
      *puVar3 = *puVar3 & 0xfffffffe;
      return;
    }
    this->m_Timer = this->m_Speed;
    plVar9 = this->m_Line1;
    psVar10 = plVar9->sidedef[0];
    pFVar6 = pFVar4->TextureFrames;
    iVar7 = pFVar6[uVar1].texnum;
    break;
  case 3:
switchD_003eb5d0_caseD_3:
    (((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->ceilingdata).field_0.
    p = (DSectorEffect *)0x0;
LAB_003eb6cc:
    (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
      _vptr_DObject[4])(this);
    return;
  default:
    goto switchD_003eb5d0_default;
  }
  psVar10->textures[1].texture.texnum = iVar7;
  plVar9->sidedef[1]->textures[1].texture.texnum = pFVar6[this->m_Frame].texnum;
  plVar9 = this->m_Line2;
  plVar9->sidedef[0]->textures[1].texture.texnum = pFVar6[this->m_Frame].texnum;
  plVar9->sidedef[1]->textures[1].texture.texnum = pFVar6[this->m_Frame].texnum;
switchD_003eb5d0_default:
  return;
}

Assistant:

void DAnimatedDoor::Tick ()
{
	if (m_DoorAnim == NULL)
	{
		// can only happen when a bad savegame is loaded.
		Destroy();
		return;
	}

	switch (m_Status)
	{
	case Dead:
		m_Sector->ceilingdata = NULL;
		Destroy ();
		break;

	case Opening:
		if (!m_Timer--)
		{
			if (++m_Frame >= m_DoorAnim->NumTextureFrames)
			{
				// IF DOOR IS DONE OPENING...
				m_Line1->flags &= ~ML_BLOCKING;
				m_Line2->flags &= ~ML_BLOCKING;

				if (m_Delay == 0)
				{
					m_Sector->ceilingdata = NULL;
					Destroy ();
					break;
				}

				m_Timer = m_Delay;
				m_Status = Waiting;
			}
			else
			{
				// IF DOOR NEEDS TO ANIMATE TO NEXT FRAME...
				m_Timer = m_Speed;

				m_Line1->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line1->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
			}
		}
		break;

	case Waiting:
		// IF DOOR IS DONE WAITING...
		if (!m_Timer--)
		{
			if (!StartClosing())
			{
				m_Timer = m_Delay;
			}
		}
		break;

	case Closing:
		if (!m_Timer--)
		{
			if (--m_Frame < 0)
			{
				// IF DOOR IS DONE CLOSING...
				m_Sector->MoveCeiling (2048., m_BotDist, -1);
				m_Sector->ceilingdata = NULL;
				Destroy ();
				// Unset blocking flags on lines that didn't start with them. Since the
				// ceiling is down now, we shouldn't need this flag anymore to keep things
				// from getting through.
				if (!m_SetBlocking1)
				{
					m_Line1->flags &= ~ML_BLOCKING;
				}
				if (!m_SetBlocking2)
				{
					m_Line2->flags &= ~ML_BLOCKING;
				}
				break;
			}
			else
			{
				// IF DOOR NEEDS TO ANIMATE TO NEXT FRAME...
				m_Timer = m_Speed;

				m_Line1->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line1->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
			}
		}
		break;
	}
}